

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::deserialize<dap::Source>(Deserializer *this,optional<dap::Source> *opt)

{
  bool bVar1;
  undefined1 local_148 [8];
  Source v;
  optional<dap::Source> *opt_local;
  Deserializer *this_local;
  
  v.sources._24_8_ = opt;
  Source::Source((Source *)local_148);
  bVar1 = deserialize<dap::Source,std::enable_if<true,void>>(this,(Source *)local_148);
  if (bVar1) {
    optional<dap::Source>::operator=((optional<dap::Source> *)v.sources._24_8_,(Source *)local_148);
  }
  Source::~Source((Source *)local_148);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}